

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSaxFWLError.cpp
# Opt level: O3

void __thiscall
COLLADASaxFWL::SaxFWLError::SaxFWLError
          (SaxFWLError *this,ErrorType errorType,String *errorMessage,Severity severity)

{
  pointer pcVar1;
  
  (this->super_IError)._vptr_IError = (_func_int **)&PTR__SaxFWLError_009053d0;
  this->mErrorType = errorType;
  this->mSeverity = severity;
  (this->mErrorMessage)._M_dataplus._M_p = (pointer)&(this->mErrorMessage).field_2;
  pcVar1 = (errorMessage->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mErrorMessage,pcVar1,pcVar1 + errorMessage->_M_string_length);
  this->mLineNumber = 0;
  this->mColumnNumber = 0;
  return;
}

Assistant:

SaxFWLError::SaxFWLError( ErrorType errorType, String errorMessage, IError::Severity severity )
		: mErrorType(errorType)
		, mSeverity(severity)
		, mErrorMessage(errorMessage)
		, mLineNumber(0)
		, mColumnNumber(0)
	{
	}